

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodetree.c
# Opt level: O2

void RemoveChild(nodetree *p,nodetree *Child)

{
  nodetree *pnVar1;
  nodetree **ppnVar2;
  nodetree **ppnVar3;
  
  ppnVar2 = &p->Children;
  do {
    ppnVar3 = ppnVar2;
    pnVar1 = *ppnVar3;
    if (pnVar1 == (nodetree *)0x0) goto LAB_00106913;
    ppnVar2 = &pnVar1->Next;
  } while (pnVar1 != Child);
  *ppnVar3 = Child->Next;
LAB_00106913:
  Child->Parent = (nodetree *)0x0;
  Child->Next = (nodetree *)0x0;
  return;
}

Assistant:

static void RemoveChild(nodetree* p,nodetree* Child)
{
	nodetree** i;

	for (i=&p->Children;*i;i=&(*i)->Next)
		if (*i==Child)
		{
			*i=Child->Next;
			break;
		}

	Child->Next = NULL;
    Child->Parent = NULL;
}